

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_pointerLikeType_createPointerLikeStoreFunction
          (sysbvm_context_t *context,sysbvm_tuple_t pointerLikeType_,sysbvm_tuple_t baseType_,
          sysbvm_bitflags_t extraFlags)

{
  sysbvm_stackFrameRecord_t local_68;
  undefined8 local_58;
  sysbvm_tuple_t *local_50;
  sysbvm_tuple_t local_40;
  sysbvm_tuple_t local_38;
  sysbvm_tuple_t *local_30;
  sysbvm_tuple_t sStack_28;
  
  local_50 = &local_40;
  local_30 = (sysbvm_tuple_t *)0x0;
  sStack_28 = 0;
  local_68.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_68.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_68._12_4_ = 0;
  local_58 = 4;
  local_40 = pointerLikeType_;
  local_38 = baseType_;
  sysbvm_stackFrame_pushRecord(&local_68);
  local_30 = (sysbvm_tuple_t *)
             sysbvm_function_copy(context,(context->roots).pointerLikeStorePrimitive);
  sysbvm_function_addFlags(context,(sysbvm_tuple_t)local_30,extraFlags);
  sStack_28 = sysbvm_type_createSimpleFunctionTypeWithArguments2(context,local_40,local_38,local_40)
  ;
  *local_30 = sStack_28;
  sysbvm_stackFrame_popRecord(&local_68);
  return (sysbvm_tuple_t)local_30;
}

Assistant:

static sysbvm_tuple_t sysbvm_pointerLikeType_createPointerLikeStoreFunction(sysbvm_context_t *context, sysbvm_tuple_t pointerLikeType_, sysbvm_tuple_t baseType_, sysbvm_bitflags_t extraFlags)
{
    struct {
        sysbvm_tuple_t pointerLikeType;
        sysbvm_tuple_t baseType;
        sysbvm_tuple_t function;
        sysbvm_tuple_t functionType;
    } gcFrame = {
        .pointerLikeType = pointerLikeType_,
        .baseType = baseType_,
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.function = sysbvm_function_copy(context, context->roots.pointerLikeStorePrimitive);
    sysbvm_function_addFlags(context, gcFrame.function, extraFlags);

    gcFrame.functionType = sysbvm_type_createSimpleFunctionTypeWithArguments2(context, gcFrame.pointerLikeType, gcFrame.baseType, gcFrame.pointerLikeType);
    sysbvm_tuple_setType((sysbvm_object_tuple_t*)gcFrame.function, gcFrame.functionType);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.function;
}